

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O2

void __thiscall
Am_Object_Data::Am_Object_Data(Am_Object_Data *this,char *schema_name,Am_Object_Data *in_prototype)

{
  uint *puVar1;
  unsigned_short uVar2;
  
  (this->super_Am_Wrapper).refs = 1;
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_002ea918;
  this->demon_set = in_prototype->demon_set;
  Am_Demon_Queue::Am_Demon_Queue(&this->demon_queue,&in_prototype->demon_queue);
  Am_Slot_Data::Am_Slot_Data(&this->owner_slot,(Am_Object_Data *)0x0,10);
  Am_Slot_Data::Am_Slot_Data(&this->part_slot,(Am_Object_Data *)0x0,0);
  DynArray::DynArray(&this->data,8);
  this->prototype = in_prototype;
  puVar1 = &(in_prototype->super_Am_Wrapper).refs;
  *puVar1 = *puVar1 + 1;
  this->next_instance = in_prototype->first_instance;
  in_prototype->first_instance = this;
  uVar2 = in_prototype->bits_mask;
  this->default_bits = in_prototype->default_bits;
  this->bits_mask = uVar2;
  this->default_rule = in_prototype->default_rule;
  this->demon_set->refs = this->demon_set->refs + 1;
  this->demons_active = in_prototype->demons_active & 0x8000;
  this->first_instance = (Am_Object_Data *)0x0;
  (this->owner_slot).context = this;
  (this->owner_slot).super_Am_Value.value.wrapper_value = (Am_Wrapper *)0x0;
  (this->owner_slot).super_Am_Value.type = 0xa001;
  this->first_part = (Am_Object_Data *)0x0;
  this->next_part = (Am_Object_Data *)0x0;
  (this->part_slot).super_Am_Value.value.wrapper_value = &this->super_Am_Wrapper;
  (this->part_slot).super_Am_Value.type = 0xa001;
  (this->part_slot).field_0x38 = 0x20;
  return;
}

Assistant:

Am_Object_Data::Am_Object_Data(const char *schema_name,
                               Am_Object_Data *in_prototype)
    : owner_slot(nullptr, Am_OWNER), part_slot(nullptr, Am_NO_SLOT),
      demon_set(in_prototype->demon_set),
      demon_queue(in_prototype->demon_queue), data(sizeof(Am_Slot_Data *))
{
#ifdef DEBUG
  if (schema_name) {
#ifdef LEAK_TRACE
    std::cout << schema_name << "\t\tcreated: " << this
              << "\tReferences: " << Ref_Count() << std::endl;
#endif

    char *name = new char[strlen(schema_name) + 1];
    strcpy(name, schema_name);
    Am_Register_Name(this, name);
  } else {
    const char *proto_name = Am_Get_Name_Of_Item(in_prototype);
    if (proto_name == nullptr) {
      std::cout << "Warning: instantiating object without a registered name!\n"
                << std::flush;
#ifdef LEAK_TRACE
      std::cout << proto_name << "\t\tcreated: " << this
                << "\tReferences: " << Ref_Count() << std::endl;
#endif
      Am_Register_Name(this, append_number_to_name("Warning_nullptr"));
    } else {
#ifdef LEAK_TRACE
      std::cout << proto_name << "\t\tcreated: " << this
                << "\tReferences: " << Ref_Count() << std::endl;
#endif

      Am_Register_Name(this, append_number_to_name(proto_name));
    }
  }
#endif

  prototype = in_prototype;
  in_prototype->Note_Reference();
  next_instance = in_prototype->first_instance;
  in_prototype->first_instance = this;
  default_bits = in_prototype->default_bits;
  bits_mask = in_prototype->bits_mask;
  default_rule = in_prototype->default_rule;
  demon_set->Note_Reference();
  demons_active = in_prototype->demons_active & DEMONS_ACTIVE;
  first_instance = nullptr;
  owner_slot.context = this;
  owner_slot.value.wrapper_value = nullptr;
  owner_slot.type = Am_OBJECT;
  first_part = nullptr;
  next_part = nullptr;
  part_slot.value.wrapper_value = this;
  part_slot.type = Am_OBJECT;
  part_slot.flags = BIT_IS_PART;
}